

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O3

void test_serve_locations(void)

{
  int status_code;
  uint uVar1;
  uint uVar2;
  char *path;
  cio_error cVar3;
  long lVar4;
  cio_http_location target2;
  cio_http_location target1;
  cio_http_server_configuration config;
  cio_http_server server;
  cio_http_location local_278;
  cio_http_location local_258;
  cio_http_server_configuration local_238;
  cio_http_server local_180;
  
  lVar4 = 0x20;
  do {
    header_complete_fake.custom_fake = callback_write_ok_response;
    memcpy(&local_238,&DAT_001189e0,0xb8);
    cVar3 = cio_http_server_init(&local_180,&loop,&local_238);
    UnityAssertEqualNumber
              (0,(long)cVar3,"Server initialization failed!",0x46c,UNITY_DISPLAY_STYLE_INT);
    path = *(char **)((long)&DAT_00117bf0 + lVar4);
    status_code = *(int *)((long)&DAT_00117c08 + lVar4);
    uVar1 = *(uint *)(&UNK_00117c0c + lVar4);
    uVar2 = *(uint *)((long)&test_serve_locations::location_tests[0].location + lVar4);
    split_request(*(char **)((long)&PTR_http_close_hook_00117c00 + lVar4));
    cVar3 = cio_http_location_init(&local_258,path,(void *)0x0,alloc_dummy_handler);
    UnityAssertEqualNumber
              (0,(long)cVar3,"Request target1 initialization failed!",0x475,UNITY_DISPLAY_STYLE_INT)
    ;
    cVar3 = cio_http_server_register_location(&local_180,&local_258);
    UnityAssertEqualNumber
              (0,(long)cVar3,"Register request target1 failed!",0x477,UNITY_DISPLAY_STYLE_INT);
    cVar3 = cio_http_location_init(&local_278,"/foo/bar",(void *)0x1,alloc_dummy_handler);
    UnityAssertEqualNumber
              (0,(long)cVar3,"Request target2 initialization failed!",0x47c,UNITY_DISPLAY_STYLE_INT)
    ;
    cVar3 = cio_http_server_register_location(&local_180,&local_278);
    UnityAssertEqualNumber
              (0,(long)cVar3,"Register request target2 failed!",0x47e,UNITY_DISPLAY_STYLE_INT);
    cVar3 = cio_http_server_serve(&local_180);
    UnityAssertEqualNumber(0,(long)cVar3,"Serving http failed!",0x481,UNITY_DISPLAY_STYLE_INT);
    check_http_response(status_code);
    UnityAssertEqualNumber
              (0,(ulong)message_complete_fake.call_count,"on_message_complete was not called!",0x485
               ,UNITY_DISPLAY_STYLE_INT);
    if (status_code == 200) {
      UnityAssertEqualNumber
                (1,(ulong)header_complete_fake.call_count,"on_header_complete was not called!",0x487
                 ,UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualNumber
                (1,(ulong)response_written_cb_fake.call_count,
                 "response_written callback was not called!",0x488,UNITY_DISPLAY_STYLE_INT);
    }
    UnityAssertEqualNumber
              ((ulong)uVar1,(ulong)location_handler_called_fake.call_count,
               "location handler was not called correctly",0x48b,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((ulong)uVar2,(ulong)sub_location_handler_called_fake.call_count,
               "sub_location handler was not called correctly",0x48c,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)cio_buffered_stream_close_fake.call_count,"buffered stream was not closed!",
               0x48e,UNITY_DISPLAY_STYLE_INT);
    setUp();
    lVar4 = lVar4 + 0x28;
  } while (lVar4 != 0x188);
  free(&client_socket[-2].impl.close_timer.impl.ev.fd);
  return;
}

Assistant:

static void test_serve_locations(void)
{
	struct location_test {
		const char *location;
		const char *sub_location;
		const char *request_target;
		int expected_response;
		unsigned int location_call_count;
		unsigned int sub_location_call_count;
	};

	static const struct location_test location_tests[] = {
	    {.location = "/foo", .sub_location = "/foo/bar", .request_target = "GET /foo HTTP/1.1" CRLF CRLF, .expected_response = 200, .location_call_count = 1, .sub_location_call_count = 0},
	    {.location = "/foo", .sub_location = "/foo/bar", .request_target = "GET /foo/ HTTP/1.1" CRLF CRLF, .expected_response = 200, .location_call_count = 1, .sub_location_call_count = 0},
	    {.location = "/foo", .sub_location = "/foo/bar", .request_target = "GET /foo/bar HTTP/1.1" CRLF CRLF, .expected_response = 200, .location_call_count = 0, .sub_location_call_count = 1},
	    {.location = "/foo", .sub_location = "/foo/bar", .request_target = "GET /foo2 HTTP/1.1" CRLF CRLF, .expected_response = 404, .location_call_count = 0, .sub_location_call_count = 0},
	    {.location = "", .sub_location = "/foo/bar", .request_target = "GET /foo2 HTTP/1.1" CRLF CRLF, .expected_response = 404, .location_call_count = 0, .sub_location_call_count = 0},
	    {.location = "/foo/", .sub_location = "/foo/bar", .request_target = "GET /foo HTTP/1.1" CRLF CRLF, .expected_response = 404, .location_call_count = 0, .sub_location_call_count = 0},
	    {.location = "/foo/", .sub_location = "/foo/bar", .request_target = "GET /foo/ HTTP/1.1" CRLF CRLF, .expected_response = 200, .location_call_count = 1, .sub_location_call_count = 0},
	    {.location = "/foo/", .sub_location = "/foo/bar", .request_target = "GET /foo/bar HTTP/1.1" CRLF CRLF, .expected_response = 200, .location_call_count = 0, .sub_location_call_count = 1},
	    {.location = "/foo/", .sub_location = "/foo/bar", .request_target = "GET /foo2 HTTP/1.1" CRLF CRLF, .expected_response = 404, .location_call_count = 0, .sub_location_call_count = 0},
	};

	for (unsigned int i = 0; i < ARRAY_SIZE(location_tests); i++) {
		header_complete_fake.custom_fake = callback_write_ok_response;

		struct cio_http_server_configuration config = {
		    .on_error = serve_error,
		    .read_header_timeout_ns = header_read_timeout,
		    .read_body_timeout_ns = body_read_timeout,
		    .response_timeout_ns = response_timeout,
		    .close_timeout_ns = 10,
		    .alloc_client = alloc_dummy_client,
		    .free_client = free_dummy_client};

		struct cio_http_server server;
		enum cio_error err = cio_http_server_init(&server, &loop, &config);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");

		struct location_test location_test = location_tests[i];

		split_request(location_test.request_target);

		struct cio_http_location target1;
		uintptr_t loc_marker = 0;
		err = cio_http_location_init(&target1, location_test.location, (void *)loc_marker, alloc_dummy_handler);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Request target1 initialization failed!");
		err = cio_http_server_register_location(&server, &target1);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Register request target1 failed!");

		struct cio_http_location target2;
		uintptr_t sub_loc_marker = 1;
		err = cio_http_location_init(&target2, location_test.sub_location, (void *)sub_loc_marker, alloc_dummy_handler);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Request target2 initialization failed!");
		err = cio_http_server_register_location(&server, &target2);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Register request target2 failed!");

		err = cio_http_server_serve(&server);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Serving http failed!");

		check_http_response(location_test.expected_response);

		TEST_ASSERT_EQUAL_MESSAGE(0, message_complete_fake.call_count, "on_message_complete was not called!");
		if (location_test.expected_response == 200) {
			TEST_ASSERT_EQUAL_MESSAGE(1, header_complete_fake.call_count, "on_header_complete was not called!");
			TEST_ASSERT_EQUAL_MESSAGE(1, response_written_cb_fake.call_count, "response_written callback was not called!");
		}

		TEST_ASSERT_EQUAL_MESSAGE(location_test.location_call_count, location_handler_called_fake.call_count, "location handler was not called correctly");
		TEST_ASSERT_EQUAL_MESSAGE(location_test.sub_location_call_count, sub_location_handler_called_fake.call_count, "sub_location handler was not called correctly");

		TEST_ASSERT_EQUAL_MESSAGE(1, cio_buffered_stream_close_fake.call_count, "buffered stream was not closed!");

		setUp();
	}

	free_dummy_client(client_socket);
}